

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O3

int __thiscall iDynTree::Visualizer::getModelInstanceIndex(Visualizer *this,string *instanceName)

{
  iDynTree::reportError
            ("Visualizer","getModelInstanceIndex",
             "Impossible to find model instance with the specified name");
  return -1;
}

Assistant:

int Visualizer::getModelInstanceIndex(const std::string instanceName)
{
#ifdef IDYNTREE_USES_IRRLICHT
    for(size_t mdlInst=0; mdlInst < getNrOfVisualizedModels(); mdlInst++)
    {
        if( pimpl->m_modelViz->at(mdlInst)->getInstanceName() == instanceName )
        {
            return static_cast<int>(mdlInst);
        }
    }
#else
    IDYNTREE_UNUSED(instanceName);
#endif

    reportError("Visualizer","getModelInstanceIndex","Impossible to find model instance with the specified name");
    return -1;
}